

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::updateStandaloneQualifierDefaults
          (HlslParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  TLayoutGeometry geometry;
  TVertexSpacing TVar1;
  TVertexOrder TVar2;
  uint uVar3;
  TIntermediate *pTVar4;
  ulong uVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer pTVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  int *piVar11;
  undefined4 extraout_var;
  long lVar12;
  undefined4 extraout_var_00;
  long *plVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  _func_int **pp_Var18;
  long lVar19;
  int iVar20;
  
  if (((publicType->shaderQualifiers).vertices != -1) &&
     (((this->super_TParseContextBase).super_TParseVersions.language | EShLangTessEvaluation) !=
      EShLangGeometry)) {
    __assert_fail("language == EShLangTessControl || language == EShLangGeometry",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x242c,
                  "void glslang::HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                 );
  }
  iVar20 = (publicType->shaderQualifiers).invocations;
  if (iVar20 != -1) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar9 = pTVar4->invocations;
    if (iVar9 == -1) {
      pTVar4->invocations = iVar20;
    }
    else if (iVar9 != iVar20) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","invocations","");
    }
  }
  geometry = (publicType->shaderQualifiers).geometry;
  if (geometry != ElgNone) {
    uVar8 = *(uint *)&(publicType->qualifier).field_0x8 & 0x7f;
    if (uVar8 == 4) {
      handleOutputGeometry(this,loc,&(publicType->shaderQualifiers).geometry);
    }
    else {
      if (uVar8 == 3) {
        if ((geometry < (ElgQuads|ElgLines)) && ((0x36eU >> (geometry & 0x1f) & 1) != 0))
        goto LAB_0039cd27;
        pcVar10 = TQualifier::getGeometryString(geometry);
        pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar16 = "cannot apply to input";
        pcVar17 = "";
      }
      else {
        pcVar10 = TQualifier::getGeometryString(geometry);
        pcVar17 = GetStorageQualifierString
                            (*(TStorageQualifier *)&(publicType->qualifier).field_0x8 & 0x7f);
        pp_Var18 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar16 = "cannot apply to:";
      }
      (*pp_Var18[0x2d])(this,loc,pcVar16,pcVar10,pcVar17);
    }
  }
LAB_0039cd27:
  TVar1 = (publicType->shaderQualifiers).spacing;
  if ((TVar1 != EvsNone) &&
     (pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
     pTVar4->vertexSpacing == EvsNone)) {
    pTVar4->vertexSpacing = TVar1;
  }
  TVar2 = (publicType->shaderQualifiers).order;
  if ((TVar2 != EvoNone) &&
     (pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
     pTVar4->vertexOrder == EvoNone)) {
    pTVar4->vertexOrder = TVar2;
  }
  if ((publicType->shaderQualifiers).pointMode == true) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
  }
  iVar20 = 0;
  for (lVar19 = 0; lVar19 != 0xc; lVar19 = lVar19 + 4) {
    if (1 < *(int *)((long)(publicType->shaderQualifiers).localSize + lVar19)) {
      piVar11 = &(this->super_TParseContextBase).resources.maxComputeWorkGroupSizeX;
      if ((iVar20 != 0) &&
         (piVar11 = &(this->super_TParseContextBase).resources.maxComputeWorkGroupSizeZ, iVar20 != 2
         )) {
        piVar11 = &(this->super_TParseContextBase).resources.maxComputeWorkGroupSizeY;
      }
      if ((uint)*piVar11 <
          *(uint *)((long)((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                          localSize + lVar19)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too large; see gl_MaxComputeWorkGroupSize","local_size","");
      }
      iVar9 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0xc0))
                         ((long *)CONCAT44(extraout_var,iVar9));
      lVar12 = *(long *)(*(long *)(lVar12 + 8) + 8);
      *(undefined4 *)(lVar12 + lVar19 * 4) =
           *(undefined4 *)
            ((long)((this->super_TParseContextBase).super_TParseVersions.intermediate)->localSize +
            lVar19);
      *(undefined4 *)(lVar12 + 8 + lVar19 * 4) = 9;
    }
    iVar9 = *(int *)((long)(publicType->shaderQualifiers).localSizeSpecId + lVar19);
    if (iVar9 != -1) {
      pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (*(int *)((long)pTVar4->localSizeSpecId + lVar19) == -1) {
        *(int *)((long)pTVar4->localSizeSpecId + lVar19) = iVar9;
      }
      iVar9 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x68))
                                  ((long *)CONCAT44(extraout_var_00,iVar9));
      lVar12 = (**(code **)(*plVar13 + 0x50))(plVar13);
      *(byte *)(lVar12 + 0xc) = *(byte *)(lVar12 + 0xc) | 1;
    }
    iVar20 = iVar20 + 1;
  }
  if ((publicType->shaderQualifiers).earlyFragmentTests != false) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests = true;
  }
  uVar5 = *(ulong *)&(publicType->qualifier).field_0x8;
  switch((uint)uVar5 & 0x7f) {
  case 3:
    break;
  case 4:
    uVar5 = *(ulong *)&(publicType->qualifier).field_0x1c;
    if ((char)(uVar5 >> 0x38) != -1) {
      *(ulong *)&(this->globalOutputDefaults).field_0x1c =
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
           uVar5 & 0xff00000000000000;
    }
    uVar14 = (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
    uVar5 = *(ulong *)&(this->globalOutputDefaults).field_0x24;
    if (uVar14 == 0xf) {
      uVar14 = (ulong)((uint)uVar5 & 0xf);
      if (uVar14 == 0xf) {
        return;
      }
    }
    else {
      *(ulong *)&(this->globalOutputDefaults).field_0x24 = uVar5 & 0xfffffffffffffff0 | uVar14;
    }
    uVar5 = *(ulong *)&(publicType->qualifier).field_0x24;
    uVar8 = (uint)uVar5;
    if ((~uVar8 & 0x3fff0) != 0) {
      uVar15 = (uint)(uVar5 >> 4) & 0x3fff;
      pTVar6 = (((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar3 = pTVar6[uVar14].stride;
      if (uVar3 == 0x3fff) {
        pTVar6[uVar14].stride = uVar15;
      }
      else if (uVar3 != uVar15) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                   (ulong)(uVar8 & 0xf));
        return;
      }
    }
    break;
  case 5:
    if (uVar5 >> 0x3d != 0) {
      *(ulong *)&(this->globalUniformDefaults).field_0x8 =
           *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar5 & 0xe000000000000000;
    }
    bVar7 = (publicType->qualifier).field_0x10 & 0xf;
    if (bVar7 != 0) {
      (this->globalUniformDefaults).field_0x10 =
           (this->globalUniformDefaults).field_0x10 & 0xf0 | bVar7;
    }
    break;
  case 6:
    if (uVar5 >> 0x3d != 0) {
      *(ulong *)&(this->globalBufferDefaults).field_0x8 =
           *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar5 & 0xe000000000000000;
    }
    bVar7 = (publicType->qualifier).field_0x10 & 0xf;
    if (bVar7 != 0) {
      (this->globalBufferDefaults).field_0x10 =
           (this->globalBufferDefaults).field_0x10 & 0xf0 | bVar7;
    }
    break;
  default:
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,
               "default qualifier requires \'uniform\', \'buffer\', \'in\', or \'out\' storage qualification"
               ,"","",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry);
        // const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                      "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            handleOutputGeometry(loc, publicType.shaderQualifiers.geometry);
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                  GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone)
        intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing);
    if (publicType.shaderQualifiers.order != EvoNone)
        intermediate.setVertexOrder(publicType.shaderQualifiers.order);
    if (publicType.shaderQualifiers.pointMode)
        intermediate.setPointMode();
    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSize[i] > 1) {
            int max = 0;
            switch (i) {
            case 0: max = resources.maxComputeWorkGroupSizeX; break;
            case 1: max = resources.maxComputeWorkGroupSizeY; break;
            case 2: max = resources.maxComputeWorkGroupSizeZ; break;
            default: break;
            }
            if (intermediate.getLocalSize(i) > (unsigned int)max)
                error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");

            // Fix the existing constant gl_WorkGroupSize with this new information.
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]);
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }
    if (publicType.shaderQualifiers.earlyFragmentTests)
        intermediate.setEarlyFragmentTests();

    const TQualifier& qualifier = publicType.qualifier;

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d",
                      qualifier.layoutXfbBuffer);
        }
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', or 'out' storage qualification", "", "");
        return;
    }
}